

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void xmlParseCatalogPI(xmlParserCtxtPtr ctxt,xmlChar *catalog)

{
  byte bVar1;
  int iVar2;
  ulong uVar3;
  xmlChar *URL;
  void *pvVar4;
  byte *pbVar5;
  byte *pbVar6;
  
  pbVar6 = catalog;
  while (((ulong)*pbVar6 < 0x21 && ((0x100002600U >> ((ulong)*pbVar6 & 0x3f) & 1) != 0))) {
    pbVar6 = pbVar6 + 1;
  }
  iVar2 = xmlStrncmp(pbVar6,"catalog",7);
  if (iVar2 == 0) {
    pbVar6 = pbVar6 + 9;
    while( true ) {
      uVar3 = (ulong)pbVar6[-2];
      if (0x3d < uVar3) {
        return;
      }
      if ((0x100002600U >> (uVar3 & 0x3f) & 1) == 0) break;
      pbVar6 = pbVar6 + 1;
    }
    if (uVar3 != 0x3d) {
      return;
    }
    while( true ) {
      uVar3 = (ulong)pbVar6[-1];
      if (0x27 < uVar3) break;
      if ((0x100002600U >> (uVar3 & 0x3f) & 1) == 0) {
        if ((0x8400000000U >> (uVar3 & 0x3f) & 1) != 0) {
          iVar2 = -1;
          pbVar5 = pbVar6;
          goto LAB_001349a2;
        }
        break;
      }
      pbVar6 = pbVar6 + 1;
    }
  }
  goto LAB_001348d7;
  while (bVar1 != pbVar6[-1]) {
LAB_001349a2:
    bVar1 = *pbVar5;
    pbVar5 = pbVar5 + 1;
    iVar2 = iVar2 + 1;
    if (bVar1 == 0) break;
  }
  if (bVar1 != 0) {
    URL = xmlStrndup(pbVar6,iVar2);
    for (; uVar3 = (ulong)*pbVar5, uVar3 < 0x21; pbVar5 = pbVar5 + 1) {
      if ((0x100002600U >> (uVar3 & 0x3f) & 1) == 0) {
        if (uVar3 == 0) {
          if (URL == (xmlChar *)0x0) {
            return;
          }
          pvVar4 = xmlCatalogAddLocal(ctxt->catalogs,URL);
          ctxt->catalogs = pvVar4;
          goto LAB_0013492b;
        }
        break;
      }
    }
    goto LAB_001348da;
  }
LAB_001348d7:
  URL = (xmlChar *)0x0;
LAB_001348da:
  xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_WAR_CATALOG_PI,XML_ERR_WARNING,catalog,
             (xmlChar *)0x0,(xmlChar *)0x0,0,"Catalog PI syntax error: %s\n",catalog,0);
  if (URL == (xmlChar *)0x0) {
    return;
  }
LAB_0013492b:
  (*xmlFree)(URL);
  return;
}

Assistant:

static void
xmlParseCatalogPI(xmlParserCtxtPtr ctxt, const xmlChar *catalog) {
    xmlChar *URL = NULL;
    const xmlChar *tmp, *base;
    xmlChar marker;

    tmp = catalog;
    while (IS_BLANK_CH(*tmp)) tmp++;
    if (xmlStrncmp(tmp, BAD_CAST"catalog", 7))
	goto error;
    tmp += 7;
    while (IS_BLANK_CH(*tmp)) tmp++;
    if (*tmp != '=') {
	return;
    }
    tmp++;
    while (IS_BLANK_CH(*tmp)) tmp++;
    marker = *tmp;
    if ((marker != '\'') && (marker != '"'))
	goto error;
    tmp++;
    base = tmp;
    while ((*tmp != 0) && (*tmp != marker)) tmp++;
    if (*tmp == 0)
	goto error;
    URL = xmlStrndup(base, tmp - base);
    tmp++;
    while (IS_BLANK_CH(*tmp)) tmp++;
    if (*tmp != 0)
	goto error;

    if (URL != NULL) {
        /*
         * Unfortunately, the catalog API doesn't report OOM errors.
         * xmlGetLastError isn't very helpful since we don't know
         * where the last error came from. We'd have to reset it
         * before this call and restore it afterwards.
         */
	ctxt->catalogs = xmlCatalogAddLocal(ctxt->catalogs, URL);
	xmlFree(URL);
    }
    return;

error:
    xmlWarningMsg(ctxt, XML_WAR_CATALOG_PI,
	          "Catalog PI syntax error: %s\n",
		  catalog, NULL);
    if (URL != NULL)
	xmlFree(URL);
}